

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
cpp_client::Any::Any<std::__cxx11::string>
          (Any *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other)

{
  holder2<std::__cxx11::string> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_local;
  Any *this_local;
  
  this_00 = (holder2<std::__cxx11::string> *)operator_new(0x28);
  holder2<std::__cxx11::string>::holder2<std::__cxx11::string>(this_00,other);
  std::unique_ptr<cpp_client::Any::holder,std::default_delete<cpp_client::Any::holder>>::
  unique_ptr<std::default_delete<cpp_client::Any::holder>,void>
            ((unique_ptr<cpp_client::Any::holder,std::default_delete<cpp_client::Any::holder>> *)
             this,(pointer)this_00);
  return;
}

Assistant:

Any(T&& other) noexcept :
      data_(new holder2<T>(std::forward<T>(other)))
   {
      ;
   }